

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O3

int __thiscall Jzon::Node::remove(Node *this,char *__filename)

{
  Data *pDVar1;
  pointer ppVar2;
  void *__s2;
  size_t __n;
  uint uVar3;
  Data *extraout_RAX;
  iterator iVar5;
  Data *pDVar4;
  
  pDVar4 = this->data;
  if ((pDVar4 != (Data *)0x0) && (pDVar4->type == T_OBJECT)) {
    detach(this);
    pDVar1 = this->data;
    iVar5._M_current =
         (pDVar1->children).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pDVar1->children).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pDVar4 = extraout_RAX;
    if (iVar5._M_current != ppVar2) {
      __s2 = *(void **)__filename;
      __n = *(size_t *)(__filename + 8);
      do {
        if (((iVar5._M_current)->first)._M_string_length == __n) {
          if (__n == 0) {
LAB_001850a5:
            iVar5 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                    ::_M_erase(&pDVar1->children,iVar5);
            return (int)iVar5._M_current;
          }
          uVar3 = bcmp(((iVar5._M_current)->first)._M_dataplus._M_p,__s2,__n);
          pDVar4 = (Data *)(ulong)uVar3;
          if (uVar3 == 0) goto LAB_001850a5;
        }
        iVar5._M_current = iVar5._M_current + 1;
      } while (iVar5._M_current != ppVar2);
    }
  }
  return (int)pDVar4;
}

Assistant:

void Node::remove(const std::string &name)
	{
		if (isObject())
		{
			detach();
			NamedNodeList &children = data->children;
			for (NamedNodeList::iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					children.erase(it);
					break;
				}
			}
		}
	}